

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::getToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  ostream *poVar11;
  bool *pbVar12;
  Token *pTVar13;
  double n;
  byte local_2f1;
  string local_218;
  string local_1f8;
  string local_1d8 [8];
  string str_1;
  string local_198 [8];
  string str;
  string local_158;
  string local_138;
  string local_118;
  int local_f4;
  undefined1 local_f0 [4];
  int i;
  stack<int,_std::deque<int,_std::allocator<int>_>_> indentsCopy;
  undefined1 local_90 [8];
  Token token;
  int spaces;
  char c;
  Tokenizer *this_local;
  
  if ((this->ungottenToken & 1U) == 0) {
    token._string.field_2._8_4_ = 0;
    while( true ) {
      plVar7 = (long *)std::istream::get((char *)this->inStream);
      bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      bVar4 = false;
      if (bVar3) {
        iVar6 = isspace((int)token._string.field_2._M_local_buf[0xf]);
        bVar4 = false;
        if (iVar6 != 0) {
          bVar4 = token._string.field_2._M_local_buf[0xf] != '\n';
        }
      }
      if (!bVar4) break;
      token._string.field_2._8_4_ = token._string.field_2._8_4_ + 1;
    }
    if (token._string.field_2._M_local_buf[0xf] == '#') {
      do {
        plVar7 = (long *)std::istream::get((char *)this->inStream);
        bVar4 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      } while (bVar4 && token._string.field_2._M_local_buf[0xf] != '\n');
    }
    uVar8 = std::ios::bad();
    if ((uVar8 & 1) != 0) {
      std::operator<<((ostream *)&std::cout,"Error while reading the input stream in Tokenizer.\n");
      exit(1);
    }
    Token::Token((Token *)local_90);
    bVar5 = std::ios::eof();
    uVar1 = token._string.field_2._8_4_;
    if ((bVar5 & 1) == 0) {
      if (((this->parsingANewLine & 1U) == 0) ||
         (pvVar10 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->indents),
         uVar2 = token._string.field_2._8_4_, uVar1 == *pvVar10)) {
        if (token._string.field_2._M_local_buf[0xf] == '\n') {
          pbVar12 = Token::eol((Token *)local_90);
          *pbVar12 = true;
        }
        else {
          iVar6 = isdigit((int)token._string.field_2._M_local_buf[0xf]);
          if (iVar6 == 0) {
            if (token._string.field_2._M_local_buf[0xf] == '>') {
              std::istream::putback((char)this->inStream);
              readRelOp_abi_cxx11_(&local_118,this);
              Token::setOp((Token *)local_90,&local_118);
              std::__cxx11::string::~string((string *)&local_118);
            }
            else if (token._string.field_2._M_local_buf[0xf] == '<') {
              std::istream::putback((char)this->inStream);
              readRelOp_abi_cxx11_(&local_138,this);
              Token::setOp((Token *)local_90,&local_138);
              std::__cxx11::string::~string((string *)&local_138);
            }
            else if (token._string.field_2._M_local_buf[0xf] == '!') {
              std::istream::putback((char)this->inStream);
              readRelOp_abi_cxx11_(&local_158,this);
              Token::setOp((Token *)local_90,&local_158);
              std::__cxx11::string::~string((string *)&local_158);
            }
            else if (token._string.field_2._M_local_buf[0xf] == '=') {
              iVar6 = std::istream::peek();
              if (iVar6 == 0x3d) {
                std::istream::putback((char)this->inStream);
                readRelOp_abi_cxx11_((string *)((long)&str.field_2 + 8),this);
                Token::setOp((Token *)local_90,(string *)((long)&str.field_2 + 8));
                std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
              }
              else {
                Token::symbol((Token *)local_90,token._string.field_2._M_local_buf[0xf]);
              }
            }
            else if (token._string.field_2._M_local_buf[0xf] == '\"') {
              std::__cxx11::string::string(local_198);
              while (iVar6 = std::istream::peek(), iVar6 != 0x22) {
                std::istream::get((char *)this->inStream);
                std::__cxx11::string::operator+=(local_198,token._string.field_2._M_local_buf[0xf]);
              }
              std::istream::get((char *)this->inStream);
              std::__cxx11::string::string((string *)(str_1.field_2._M_local_buf + 8),local_198);
              Token::setString((Token *)local_90,(string *)((long)&str_1.field_2 + 8));
              std::__cxx11::string::~string((string *)(str_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string(local_198);
            }
            else if ((token._string.field_2._M_local_buf[0xf] == '/') &&
                    (iVar6 = std::istream::peek(), iVar6 == 0x2f)) {
              std::__cxx11::string::string(local_1d8);
              std::__cxx11::string::operator+=(local_1d8,token._string.field_2._M_local_buf[0xf]);
              std::istream::get((char *)this->inStream);
              std::__cxx11::string::operator+=(local_1d8,token._string.field_2._M_local_buf[0xf]);
              std::__cxx11::string::string((string *)&local_1f8,local_1d8);
              Token::setOp((Token *)local_90,&local_1f8);
              std::__cxx11::string::~string((string *)&local_1f8);
              std::__cxx11::string::~string(local_1d8);
            }
            else if ((token._string.field_2._M_local_buf[0xf] == '+') ||
                    ((((token._string.field_2._M_local_buf[0xf] == '-' ||
                       (token._string.field_2._M_local_buf[0xf] == '*')) ||
                      (token._string.field_2._M_local_buf[0xf] == '/')) ||
                     (token._string.field_2._M_local_buf[0xf] == '%')))) {
              Token::symbol((Token *)local_90,token._string.field_2._M_local_buf[0xf]);
            }
            else if (token._string.field_2._M_local_buf[0xf] == ';') {
              Token::symbol((Token *)local_90,';');
            }
            else if (token._string.field_2._M_local_buf[0xf] == ':') {
              Token::symbol((Token *)local_90,':');
            }
            else if ((token._string.field_2._M_local_buf[0xf] == '(') ||
                    (token._string.field_2._M_local_buf[0xf] == ')')) {
              Token::symbol((Token *)local_90,token._string.field_2._M_local_buf[0xf]);
            }
            else if ((token._string.field_2._M_local_buf[0xf] == '{') ||
                    (token._string.field_2._M_local_buf[0xf] == '}')) {
              Token::symbol((Token *)local_90,token._string.field_2._M_local_buf[0xf]);
            }
            else if ((token._string.field_2._M_local_buf[0xf] == '[') ||
                    (token._string.field_2._M_local_buf[0xf] == ']')) {
              Token::symbol((Token *)local_90,token._string.field_2._M_local_buf[0xf]);
            }
            else if (token._string.field_2._M_local_buf[0xf] == ',') {
              Token::symbol((Token *)local_90,',');
            }
            else if (token._string.field_2._M_local_buf[0xf] == '.') {
              Token::symbol((Token *)local_90,'.');
            }
            else {
              iVar6 = isalpha((int)token._string.field_2._M_local_buf[0xf]);
              if (iVar6 == 0) {
                poVar11 = std::operator<<((ostream *)&std::cout,"Unknown character in input. ->");
                poVar11 = std::operator<<(poVar11,token._string.field_2._M_local_buf[0xf]);
                poVar11 = std::operator<<(poVar11,"<-");
                std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                exit(1);
              }
              std::istream::putback((char)this->inStream);
              readName_abi_cxx11_(&local_218,this);
              Token::setName((Token *)local_90,&local_218);
              std::__cxx11::string::~string((string *)&local_218);
            }
          }
          else {
            std::istream::putback((char)this->inStream);
            n = readInteger(this);
            Token::setWholeNumber((Token *)local_90,n);
          }
        }
      }
      else {
        pvVar10 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->indents);
        uVar1 = token._string.field_2._8_4_;
        if (*pvVar10 < (int)uVar2) {
          std::istream::unget();
          Token::setIndent((Token *)local_90,token._string.field_2._8_4_);
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                    (&this->indents,(value_type *)(token._string.field_2._M_local_buf + 8));
        }
        else {
          pvVar10 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->indents);
          if ((int)uVar1 < *pvVar10) {
            std::stack<int,_std::deque<int,_std::allocator<int>_>_>::stack
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_f0,&this->indents
                      );
            while ((bVar4 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                                       local_f0), uVar1 = token._string.field_2._8_4_,
                   ((bVar4 ^ 0xffU) & 1) != 0 &&
                   (pvVar10 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                                        ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
                                         local_f0), uVar1 != *pvVar10))) {
              std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                        ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_f0);
            }
            bVar4 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_f0);
            if (bVar4) {
              poVar11 = std::operator<<((ostream *)&std::cout,"BAD DEDENT: ");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,token._string.field_2._8_4_);
              std::operator<<(poVar11," spaces.\n");
              exit(1);
            }
            std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->indents);
            pbVar12 = Token::isDedent((Token *)local_90);
            *pbVar12 = true;
            for (local_f4 = token._string.field_2._8_4_; -1 < local_f4; local_f4 = local_f4 + -1) {
              std::istream::unget();
            }
            std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
                      ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_f0);
          }
        }
      }
    }
    else {
      sVar9 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::size(&this->indents);
      if (sVar9 < 2) {
        pbVar12 = Token::eof((Token *)local_90);
        *pbVar12 = true;
      }
      else {
        std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->indents);
        pbVar12 = Token::isDedent((Token *)local_90);
        *pbVar12 = true;
        std::istream::unget();
      }
    }
    pbVar12 = Token::eol((Token *)local_90);
    local_2f1 = 1;
    if ((*pbVar12 & 1U) == 0) {
      pbVar12 = Token::isDedent((Token *)local_90);
      local_2f1 = *pbVar12;
    }
    this->parsingANewLine = (bool)(local_2f1 & 1);
    std::vector<Token,_std::allocator<Token>_>::push_back(&this->_tokens,(value_type *)local_90);
    pTVar13 = Token::operator=(&this->lastToken,(Token *)local_90);
    Token::Token(__return_storage_ptr__,pTVar13);
    Token::~Token((Token *)local_90);
  }
  else {
    this->ungottenToken = false;
    Token::Token(__return_storage_ptr__,&this->lastToken);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getToken() {

    if (ungottenToken) {
        ungottenToken = false;
        return lastToken;
    }

    char c;
    int spaces = 0;
    while( inStream.get(c) && isspace(c) && c != '\n' )  // Skip spaces but not new-line chars.
        spaces++;

    if (c == '#') while (inStream.get(c) && c != '\n');  // Skip spaces and new-line chars.;

    if(inStream.bad()) {
        std::cout << "Error while reading the input stream in Tokenizer.\n";
        exit(1);
    }


    Token token;

    if (inStream.eof()) {
        if(indents.size() > 1){
            indents.pop();
            token.isDedent() = true;
            inStream.unget();
        } else token.eof() = true;
    } else if(parsingANewLine && spaces != indents.top()){ //Indent Handling
        if (spaces > indents.top()) {
            inStream.unget();
            token.setIndent(spaces);
            indents.push(spaces);
        } else if (spaces < indents.top()) {
            std::stack<int>indentsCopy = indents;
            while(!indentsCopy.empty()){
                if(spaces == indentsCopy.top())
                    break;
                indentsCopy.pop();
            }
            if(indentsCopy.empty()){
                std::cout << "BAD DEDENT: " << spaces << " spaces.\n";
                exit(1);
            } else {
                indents.pop();
                token.isDedent() = true;
                for (int i = spaces; i >= 0; i--)
                    inStream.unget();
            }
        }
    }
//    else if (spaces > indents.top() && parsingANewLine) {
//        indents.push(spaces);
//        inStream.putback(c);
//        token.isIndent() = true;
//        parsingANewLine = false;
//    } else if (spaces < indents.top() && parsingANewLine && c != '\n') {
//        while (!indents.empty()) {
//            indents.pop();
//            dedents++;
//            if(indents.top() == spaces)
//                break;
//
//        }
//        if (indents.empty()) {
//            std::cout << "Indentation error..." << std::endl;
//            exit(2);
//        }
//        inStream.putback(c);
//        token.isDedent() = true;
//        parsingANewLine = false;
//    }
    else if (c == '\n') {  // will not ever be the case unless new-line characters are not supressed.
        //parsingANewLine = true;
        token.eol() = true;
    } else if (isdigit(c)) { // a integer?
        // put the digit back into the input stream so
        // we read the entire number in a function
        inStream.putback(c);
        token.setWholeNumber(readInteger());
        //parsingANewLine = false;
    } else if (c == '>') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '<') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '!') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '=') {
        if (inStream.peek() == '=') {
            inStream.putback(c);
            token.setOp(readRelOp());

        } else token.symbol(c);
    } else if (c == '"') {
        std::string str;
        while (inStream.peek() != '"') {
            inStream.get(c);
            str += c;
        }
        inStream.get(c);
        token.setString(str);

    } else if ((c == '/') && (inStream.peek() == '/')) {
        std::string str;
        str += c;
        inStream.get(c);
        str += c;
        token.setOp(str);
    } else if (c == '+' || c == '-' || c == '*' || c == '/' || c == '%') token.symbol(c);
    else if (c == ';') token.symbol(c);
    else if (c == ':') token.symbol(c);
    else if (c == '(' || c == ')') token.symbol(c);
    else if (c == '{' || c == '}') token.symbol(c);
    else if (c == '[' || c == ']') token.symbol(c);
    else if (c == ',') token.symbol(c);
    else if (c == '.') token.symbol(c);
    else if (isalpha(c)) {  // an identifier?
        // put c back into the stream so we can read the entire name in a function.
        inStream.putback(c);
        token.setName(readName());
        //parsingANewLine = false;
    } else {
        std::cout << "Unknown character in input. ->" << c << "<-" << std::endl;
        exit(1);
    }
    parsingANewLine = token.eol() || token.isDedent();


    _tokens.push_back(token);
    return lastToken = token;
}